

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.hpp
# Opt level: O3

void __thiscall
BSP<int>::swapVectors
          (BSP<int> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *a,vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *b)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  pointer pLVar5;
  pointer *ppiVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = (int)((long)(a->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(a->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  iVar3 = (int)((long)(b->
                      super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x49249249;
  if (iVar3 < iVar1) {
    std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::resize(b,(long)iVar1);
  }
  else if (iVar1 < iVar3) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize(a,(long)iVar3);
  }
  pLVar5 = (b->super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((b->super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish == pLVar5) {
    uVar2 = 0;
  }
  else {
    lVar7 = 0;
    lVar8 = 0;
    uVar4 = 0;
    do {
      LockableVector<int>::swap
                ((LockableVector<int> *)
                 ((long)&(pLVar5->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8),
                 (vector<int,_std::allocator<int>_> *)
                 ((long)&(((a->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar7));
      uVar4 = uVar4 + 1;
      pLVar5 = (b->super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(b->
                     super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5 >> 4) *
              0x6db6db6db6db6db7;
      lVar8 = lVar8 + 0x70;
      lVar7 = lVar7 + 0x18;
    } while (uVar4 < uVar2);
  }
  if (uVar2 != 0) {
    ppiVar6 = &(pLVar5->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    do {
      if (*ppiVar6 != ((_Vector_impl_data *)(ppiVar6 + -1))->_M_start) {
        *ppiVar6 = ((_Vector_impl_data *)(ppiVar6 + -1))->_M_start;
      }
      ppiVar6 = ppiVar6 + 0xe;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if ((a->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage ==
      (a->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  std::
  __shrink_to_fit_aux<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_true>
  ::_S_do_it(a);
  return;
}

Assistant:

void BSP<T>::swapVectors (std::vector<std::vector<T>> &a, std::vector<LockableVector<T>> &b) {
	int aSize	= a.size ();
	int bSize	= b.size ();

	// Checking if vectors have different sizes
	if (aSize > bSize) {
		b.resize (aSize);
	}
	else if ( aSize < bSize) {
		a.resize (bSize);
	}

	for (size_t i=0; i< b.size(); i++) {
		b[i].swap (a[i]);
	}

	for (size_t i=0; i< b.size(); i++) {
		b[i].getVector().clear ();
	}

	a.shrink_to_fit ();
	b.shrink_to_fit ();
}